

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O0

bool ImNodes::RenderConnection(ImVec2 *input_pos,ImVec2 *output_pos,float thickness)

{
  bool bVar1;
  float *pfVar2;
  int iVar3;
  float lhs;
  int iVar4;
  ImU32 col;
  ImDrawList *this;
  ImVec2 *a;
  ImVec2 *b;
  float thickness_00;
  float rhs;
  ImColor *local_b8;
  ImVec2 IStack_68;
  bool is_close;
  int local_60;
  float local_5c;
  int i;
  float min_square_distance;
  ImVec2 local_50;
  ImVec2 p3;
  ImVec2 local_40;
  ImVec2 p2;
  ImGuiStyle *style;
  CanvasState *canvas;
  ImDrawList *draw_list;
  float thickness_local;
  ImVec2 *output_pos_local;
  ImVec2 *input_pos_local;
  
  this = ImGui::GetWindowDrawList();
  pfVar2 = gCanvas;
  p2 = (ImVec2)ImGui::GetStyle();
  thickness_00 = thickness * *pfVar2;
  ImVec2::ImVec2(&p3,*pfVar2 * 100.0,0.0);
  local_40 = ::operator-(input_pos,&p3);
  ImVec2::ImVec2((ImVec2 *)&i,*pfVar2 * 100.0,0.0);
  local_50 = operator+(output_pos,(ImVec2 *)&i);
  ImDrawList::PathLineTo(this,input_pos);
  ImDrawList::PathBezierCurveTo(this,&local_40,&local_50,output_pos,0);
  local_5c = 3.4028235e+38;
  local_60 = 0;
  while( true ) {
    iVar3 = local_60;
    iVar4 = ImVector<ImVec2>::size(&this->_Path);
    lhs = local_5c;
    if (iVar4 + -1 <= iVar3) break;
    IStack_68 = ImGui::GetMousePos();
    a = ImVector<ImVec2>::operator[](&this->_Path,local_60);
    b = ImVector<ImVec2>::operator[](&this->_Path,local_60 + 1);
    rhs = GetDistanceToLineSquared(&stack0xffffffffffffff98,a,b);
    local_5c = ImMin<float>(lhs,rhs);
    local_60 = local_60 + 1;
  }
  bVar1 = local_5c <= thickness_00 * thickness_00;
  if (bVar1) {
    local_b8 = (ImColor *)(pfVar2 + 0x17);
  }
  else {
    local_b8 = (ImColor *)(pfVar2 + 0x13);
  }
  col = ImColor::operator_cast_to_unsigned_int(local_b8);
  ImDrawList::PathStroke(this,col,false,thickness_00);
  return bVar1;
}

Assistant:

bool RenderConnection(const ImVec2& input_pos, const ImVec2& output_pos, float thickness)
{
    ImDrawList* draw_list = ImGui::GetWindowDrawList();
    CanvasState* canvas = gCanvas;
    const ImGuiStyle& style = ImGui::GetStyle();

    thickness *= canvas->zoom;

    ImVec2 p2 = input_pos - ImVec2{100 * canvas->zoom, 0};
    ImVec2 p3 = output_pos + ImVec2{100 * canvas->zoom, 0};

    // Assemble segments for path
    draw_list->PathLineTo(input_pos);
    draw_list->PathBezierCurveTo(p2, p3, output_pos, 0);

    // Check each segment and determine if mouse is hovering curve that is to be drawn
    float min_square_distance = FLT_MAX;
    for (int i = 0; i < draw_list->_Path.size() - 1; i++)
    {
        min_square_distance = ImMin(min_square_distance,
            GetDistanceToLineSquared(ImGui::GetMousePos(), draw_list->_Path[i], draw_list->_Path[i + 1]));
    }

    // Draw curve, change when it is hovered
    bool is_close = min_square_distance <= thickness * thickness;
    draw_list->PathStroke(is_close ? canvas->colors[ColConnectionActive] : canvas->colors[ColConnection], false, thickness);
    return is_close;
}